

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7ac08::lower_tess_level_visitor::handle_rvalue
          (lower_tess_level_visitor *this,ir_rvalue **rv)

{
  ir_rvalue *ptr;
  _func_int **ptr_00;
  void *pvVar1;
  ir_expression *this_00;
  ir_variable *piVar2;
  ir_dereference_variable *this_01;
  ir_variable **ppiVar3;
  
  ptr = *rv;
  if (ptr == (ir_rvalue *)0x0) {
    return;
  }
  if ((ptr->super_ir_instruction).ir_type != ir_type_dereference_array) {
    return;
  }
  ptr_00 = ptr[1].super_ir_instruction._vptr_ir_instruction;
  if ((ptr_00[4][4] == (_func_int)0x11) &&
     (*(glsl_type **)(ptr_00[4] + 0x20) == &glsl_type::_float_type)) {
    if (this->old_tess_level_outer_var == (ir_variable *)0x0) {
      ppiVar3 = (ir_variable **)0x0;
    }
    else {
      piVar2 = (ir_variable *)(**(code **)(*ptr_00 + 0x40))(ptr_00);
      ppiVar3 = (ir_variable **)0x0;
      if (piVar2 == this->old_tess_level_outer_var) {
        ppiVar3 = &this->new_tess_level_outer_var;
      }
    }
    if (this->old_tess_level_inner_var != (ir_variable *)0x0) {
      piVar2 = (ir_variable *)(**(code **)(*ptr_00 + 0x40))(ptr_00);
      if (piVar2 == this->old_tess_level_inner_var) {
        ppiVar3 = &this->new_tess_level_inner_var;
      }
    }
    if (ppiVar3 != (ir_variable **)0x0) {
      if ((ptr_00 == (_func_int **)0x0) || (*(int *)(ptr_00 + 3) != 2)) {
        __assert_fail("ir->as_dereference_variable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0xd7,
                      "ir_rvalue *(anonymous namespace)::lower_tess_level_visitor::lower_tess_level_array(ir_rvalue *)"
                     );
      }
      pvVar1 = ralloc_parent(ptr_00);
      this_01 = (ir_dereference_variable *)exec_node::operator_new(0x30,pvVar1);
      ir_dereference_variable::ir_dereference_variable(this_01,*ppiVar3);
      goto LAB_00179710;
    }
  }
  this_01 = (ir_dereference_variable *)0x0;
LAB_00179710:
  if (this_01 != (ir_dereference_variable *)0x0) {
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
    pvVar1 = ralloc_parent(ptr);
    this_00 = (ir_expression *)exec_node::operator_new(0x58,pvVar1);
    ir_expression::ir_expression
              (this_00,0x8e,(ir_rvalue *)this_01,
               (ir_rvalue *)ptr[1].super_ir_instruction.super_exec_node.next);
    *rv = (ir_rvalue *)this_00;
  }
  return;
}

Assistant:

void
lower_tess_level_visitor::handle_rvalue(ir_rvalue **rv)
{
   if (*rv == NULL)
      return;

   ir_dereference_array *const array_deref = (*rv)->as_dereference_array();
   if (array_deref == NULL)
      return;

   /* Replace any expression that indexes one of the floats in gl_TessLevel*
    * with an expression that indexes into one of the vec4's
    * gl_TessLevel*MESA and accesses the appropriate component.
    */
   ir_rvalue *lowered_vec4 =
      this->lower_tess_level_array(array_deref->array);
   if (lowered_vec4 != NULL) {
      this->progress = true;
      void *mem_ctx = ralloc_parent(array_deref);

      ir_expression *const expr =
         new(mem_ctx) ir_expression(ir_binop_vector_extract,
                                    lowered_vec4,
                                    array_deref->array_index);

      *rv = expr;
   }
}